

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PipelineResourceSignatureBase.hpp
# Opt level: O0

void __thiscall
Diligent::PipelineResourceSignatureBase<Diligent::EngineVkImplTraits>::CalculateHash
          (PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this)

{
  size_t sVar1;
  size_t local_30;
  PipelineResourceAttribsType *local_28;
  PipelineResourceAttribsType *Attr;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *pPStack_18;
  Uint32 i;
  PipelineResourceSignatureImplType *pThisImpl;
  PipelineResourceSignatureBase<Diligent::EngineVkImplTraits> *this_local;
  
  pPStack_18 = this;
  pThisImpl = (PipelineResourceSignatureImplType *)this;
  sVar1 = CalculatePipelineResourceSignatureDescHash
                    (&(this->
                      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
                      ).m_Desc);
  this->m_Hash = sVar1;
  for (Attr._4_4_ = 0;
      Attr._4_4_ <
      (this->
      super_DeviceObjectBase<Diligent::IPipelineResourceSignature,_Diligent::RenderDeviceVkImpl,_Diligent::PipelineResourceSignatureDesc>
      ).m_Desc.NumResources; Attr._4_4_ = Attr._4_4_ + 1) {
    local_28 = GetResourceAttribs(pPStack_18,Attr._4_4_);
    local_30 = PipelineResourceAttribsVk::GetHash(local_28);
    HashCombine<unsigned_long>(&this->m_Hash,&local_30);
  }
  return;
}

Assistant:

void CalculateHash()
    {
        const PipelineResourceSignatureImplType* const pThisImpl = static_cast<const PipelineResourceSignatureImplType*>(this);

        m_Hash = CalculatePipelineResourceSignatureDescHash(this->m_Desc);
        for (Uint32 i = 0; i < this->m_Desc.NumResources; ++i)
        {
            const PipelineResourceAttribsType& Attr = pThisImpl->GetResourceAttribs(i);
            HashCombine(m_Hash, Attr.GetHash());
        }
    }